

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode setstropt_interface(char *option,char **devp,char **ifacep,char **hostp)

{
  char *pcStack_48;
  CURLcode result;
  char *host;
  char *iface;
  char *dev;
  char **hostp_local;
  char **ifacep_local;
  char **devp_local;
  char *option_local;
  
  iface = (char *)0x0;
  host = (char *)0x0;
  pcStack_48 = (char *)0x0;
  dev = (char *)hostp;
  hostp_local = ifacep;
  ifacep_local = devp;
  devp_local = (char **)option;
  if ((option == (char *)0x0) ||
     (option_local._4_4_ = Curl_parse_interface(option,&iface,&host,&stack0xffffffffffffffb8),
     option_local._4_4_ == CURLE_OK)) {
    (*Curl_cfree)(*ifacep_local);
    *ifacep_local = iface;
    (*Curl_cfree)(*hostp_local);
    *hostp_local = host;
    (*Curl_cfree)(*(void **)dev);
    *(char **)dev = pcStack_48;
    option_local._4_4_ = CURLE_OK;
  }
  return option_local._4_4_;
}

Assistant:

static CURLcode setstropt_interface(char *option, char **devp,
                                    char **ifacep, char **hostp)
{
  char *dev = NULL;
  char *iface = NULL;
  char *host = NULL;
  CURLcode result;

  DEBUGASSERT(devp);
  DEBUGASSERT(ifacep);
  DEBUGASSERT(hostp);

  if(option) {
    /* Parse the interface details if set, otherwise clear them all */
    result = Curl_parse_interface(option, &dev, &iface, &host);
    if(result)
      return result;
  }
  free(*devp);
  *devp = dev;

  free(*ifacep);
  *ifacep = iface;

  free(*hostp);
  *hostp = host;

  return CURLE_OK;
}